

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_address.c
# Opt level: O0

void cmime_address_free(CMimeAddress_T *ca)

{
  CMimeAddress_T *ca_local;
  
  if (ca != (CMimeAddress_T *)0x0) {
    if (ca->name != (char *)0x0) {
      free(ca->name);
    }
    if (ca->email != (char *)0x0) {
      free(ca->email);
    }
    free(ca);
  }
  return;
}

Assistant:

void cmime_address_free(CMimeAddress_T *ca) {
    if (ca!=NULL) {
        if (ca->name != NULL)
            free(ca->name);
        if (ca->email != NULL)
            free(ca->email);
        free(ca);
    }
}